

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_swap.cpp
# Opt level: O0

void Omega_h::filter_swap(Read<signed_char> *keep_cands,LOs *cands2edges,Reals *cand_quals)

{
  Read<double> local_d0;
  Read<int> local_c0;
  Write<double> local_b0;
  Read<double> local_a0;
  Read<int> local_90;
  Read<int> local_80;
  Write<int> local_70;
  Read<int> local_60 [2];
  Read<signed_char> local_40;
  undefined1 local_30 [8];
  LOs kept2old;
  Reals *cand_quals_local;
  LOs *cands2edges_local;
  Read<signed_char> *keep_cands_local;
  
  kept2old.write_.shared_alloc_.direct_ptr = cand_quals;
  Read<signed_char>::Read(&local_40,keep_cands);
  collect_marked((Omega_h *)local_30,&local_40);
  Read<signed_char>::~Read(&local_40);
  Read<int>::Read(&local_80,(Read<int> *)local_30);
  Read<int>::Read(&local_90,cands2edges);
  unmap<int>((Omega_h *)&local_70,&local_80,&local_90,1);
  Read<int>::Read(local_60,&local_70);
  Read<int>::operator=(cands2edges,local_60);
  Read<int>::~Read(local_60);
  Write<int>::~Write(&local_70);
  Read<int>::~Read(&local_90);
  Read<int>::~Read(&local_80);
  if (kept2old.write_.shared_alloc_.direct_ptr != (void *)0x0) {
    Read<int>::Read(&local_c0,(Read<int> *)local_30);
    Read<double>::Read(&local_d0,(Read<double> *)kept2old.write_.shared_alloc_.direct_ptr);
    unmap<double>((Omega_h *)&local_b0,&local_c0,(Read<signed_char> *)&local_d0,1);
    Read<double>::Read(&local_a0,&local_b0);
    Read<double>::operator=((Read<double> *)kept2old.write_.shared_alloc_.direct_ptr,&local_a0);
    Read<double>::~Read(&local_a0);
    Write<double>::~Write(&local_b0);
    Read<double>::~Read(&local_d0);
    Read<int>::~Read(&local_c0);
  }
  Read<int>::~Read((Read<int> *)local_30);
  return;
}

Assistant:

void filter_swap(Read<I8> keep_cands, LOs* cands2edges, Reals* cand_quals) {
  auto kept2old = collect_marked(keep_cands);
  *cands2edges = unmap(kept2old, *cands2edges, 1);
  if (cand_quals) *cand_quals = unmap(kept2old, *cand_quals, 1);
}